

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DList.h
# Opt level: O0

void __thiscall
DListBase<Memory::SegmentBase<Memory::PreReservedVirtualAllocWrapper>,_RealCount>::
Clear<Memory::NoThrowHeapAllocator>
          (DListBase<Memory::SegmentBase<Memory::PreReservedVirtualAllocWrapper>,_RealCount> *this,
          NoThrowHeapAllocator *allocator)

{
  DListNodeBase<Memory::SegmentBase<Memory::PreReservedVirtualAllocWrapper>_> *pDVar1;
  bool bVar2;
  DListNodeBase<Memory::SegmentBase<Memory::PreReservedVirtualAllocWrapper>_> **ppDVar3;
  NodeBase *next;
  NodeBase *current;
  NoThrowHeapAllocator *allocator_local;
  DListBase<Memory::SegmentBase<Memory::PreReservedVirtualAllocWrapper>,_RealCount> *this_local;
  
  ppDVar3 = DListNodeBase<Memory::SegmentBase<Memory::PreReservedVirtualAllocWrapper>_>::Next
                      (&this->
                        super_DListNodeBase<Memory::SegmentBase<Memory::PreReservedVirtualAllocWrapper>_>
                      );
  next = *ppDVar3;
  while( true ) {
    bVar2 = IsHead(this,next);
    if (((bVar2 ^ 0xffU) & 1) == 0) break;
    ppDVar3 = DListNodeBase<Memory::SegmentBase<Memory::PreReservedVirtualAllocWrapper>_>::Next
                        (next);
    pDVar1 = *ppDVar3;
    Memory::
    DeleteObject<Memory::NoThrowHeapAllocator,(Memory::AllocatorDeleteFlags)0,DListNode<Memory::SegmentBase<Memory::PreReservedVirtualAllocWrapper>>>
              (allocator,
               (DListNode<Memory::SegmentBase<Memory::PreReservedVirtualAllocWrapper>_> *)next);
    next = pDVar1;
  }
  ppDVar3 = DListNodeBase<Memory::SegmentBase<Memory::PreReservedVirtualAllocWrapper>_>::Next
                      (&this->
                        super_DListNodeBase<Memory::SegmentBase<Memory::PreReservedVirtualAllocWrapper>_>
                      );
  *ppDVar3 = &this->
              super_DListNodeBase<Memory::SegmentBase<Memory::PreReservedVirtualAllocWrapper>_>;
  ppDVar3 = DListNodeBase<Memory::SegmentBase<Memory::PreReservedVirtualAllocWrapper>_>::Prev
                      (&this->
                        super_DListNodeBase<Memory::SegmentBase<Memory::PreReservedVirtualAllocWrapper>_>
                      );
  *ppDVar3 = &this->
              super_DListNodeBase<Memory::SegmentBase<Memory::PreReservedVirtualAllocWrapper>_>;
  RealCount::SetCount(&this->super_RealCount,0);
  return;
}

Assistant:

void Clear(TAllocator * allocator)
    {
        NodeBase * current = this->Next();
        while (!this->IsHead(current))
        {
            NodeBase * next = current->Next();
            AllocatorDelete(TAllocator, allocator, (Node *)current);
            current = next;
        }

        this->Next() = this;
        this->Prev() = this;
        this->SetCount(0);
    }